

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

void __thiscall
soul::SourceCodeOperations::removeProcessor(SourceCodeOperations *this,ProcessorBase *p)

{
  SourceCodeText *o;
  SourceCodeText *o_00;
  ModuleDeclaration *pMVar1;
  CodeLocation local_38;
  CodeLocation local_28;
  
  pMVar1 = findDeclaration(this,&p->super_ModuleBase);
  if (pMVar1 != (ModuleDeclaration *)0x0) {
    o = (pMVar1->startIncludingPreamble).sourceCode.object;
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    local_38.location.data = (pMVar1->startIncludingPreamble).location.data;
    o_00 = (pMVar1->endOfClosingBrace).sourceCode.object;
    if (o_00 != (SourceCodeText *)0x0) {
      (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
    }
    local_28.location.data = (pMVar1->endOfClosingBrace).location.data;
    local_38.sourceCode.object = o;
    local_28.sourceCode.object = o_00;
    deleteText(this,&local_38,&local_28);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    reparse(this);
    return;
  }
  throwInternalCompilerError("d != nullptr","removeProcessor",0x30);
}

Assistant:

void SourceCodeOperations::removeProcessor (AST::ProcessorBase& p)
{
    auto d = findDeclaration (p);
    SOUL_ASSERT (d != nullptr);
    deleteText (d->startIncludingPreamble, d->endOfClosingBrace);
    reparse();
}